

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::visitIfStatement(CheckerVisitor *this,IfStatement *ifstmt)

{
  pointer *ppSVar1;
  VarScope *this_00;
  Node *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarScope *pVVar6;
  StackSlot local_40;
  VarScope *thenScope;
  VarScope *other;
  
  checkEmptyThenBody(this,ifstmt);
  checkDuplicateIfConditions(this,ifstmt);
  checkDuplicateIfBranches(this,ifstmt);
  checkAlwaysTrueOrFalse(this,ifstmt->_cond);
  checkSuspiciousFormatting(this,ifstmt->_thenB,&ifstmt->super_Statement);
  this_00 = this->currentScope;
  other = (VarScope *)0x0;
  iVar4 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  thenScope = (VarScope *)CONCAT44(extraout_var,iVar4);
  iVar4 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  if (ifstmt->_elseB != (Statement *)0x0) {
    iVar5 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
    other = (VarScope *)CONCAT44(extraout_var_01,iVar5);
  }
  local_40.sst = SST_NODE;
  local_40.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)ifstmt;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::emplace_back<SQCompilation::CheckerVisitor::StackSlot>(&this->nodeStack,&local_40);
  this->currentScope = (VarScope *)CONCAT44(extraout_var_00,iVar4);
  Node::visit<SQCompilation::CheckerVisitor>(&ifstmt->_cond->super_Node,this);
  this->currentScope = this_00;
  pVVar6 = other;
  if (other == (VarScope *)0x0) {
    pVVar6 = this_00;
  }
  bVar3 = false;
  speculateIfConditionHeuristics(this,ifstmt->_cond,thenScope,pVVar6,false);
  this->currentScope = thenScope;
  Node::visit<SQCompilation::CheckerVisitor>(&ifstmt->_thenB->super_Node,this);
  bVar2 = isFallThroughBranch(ifstmt->_thenB);
  this_01 = &ifstmt->_elseB->super_Node;
  if (this_01 != (Node *)0x0) {
    this->currentScope = other;
    Node::visit<SQCompilation::CheckerVisitor>(this_01,this);
    bVar3 = isFallThroughBranch(ifstmt->_elseB);
    bVar3 = !bVar3;
  }
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  if (bVar2 && !bVar3) {
    if (other == (VarScope *)0x0) {
      VarScope::merge(this_00,thenScope);
      goto LAB_00149656;
    }
    VarScope::merge(thenScope,other);
    pVVar6 = thenScope;
LAB_00149638:
    VarScope::copyFrom(this_00,pVVar6);
  }
  else {
    if (bVar2) {
      VarScope::copyFrom(this_00,thenScope);
    }
    else {
      pVVar6 = other;
      if ((bool)(other != (VarScope *)0x0 & (bVar3 ^ 1U))) goto LAB_00149638;
    }
    if (other == (VarScope *)0x0) goto LAB_00149656;
  }
  VarScope::~VarScope(other);
LAB_00149656:
  VarScope::~VarScope(thenScope);
  this->currentScope = this_00;
  return;
}

Assistant:

void CheckerVisitor::visitIfStatement(IfStatement *ifstmt) {
  checkEmptyThenBody(ifstmt);
  checkDuplicateIfConditions(ifstmt);
  checkDuplicateIfBranches(ifstmt);
  checkAlwaysTrueOrFalse(ifstmt->condition());
  checkSuspiciousFormatting(ifstmt->thenBranch(), ifstmt);

  VarScope *trunkScope = currentScope;
  VarScope *thenScope = trunkScope->copy(arena);
  VarScope *dummyScope = trunkScope->copy(arena);
  VarScope *elseScope = ifstmt->elseBranch() ? trunkScope->copy(arena) : nullptr;

  nodeStack.push_back({ SST_NODE, ifstmt });

  currentScope = dummyScope;

  ifstmt->condition()->visit(this);

  currentScope = trunkScope;

  // pass fall-through branch to not lose effects
  speculateIfConditionHeuristics(ifstmt->condition(), thenScope, elseScope ? elseScope : trunkScope);

  currentScope = thenScope;

  ifstmt->thenBranch()->visit(this);

  bool isThenFT = isFallThroughBranch(ifstmt->thenBranch());
  bool isElseFT = true;

  if (ifstmt->elseBranch()) {
    currentScope = elseScope;
    ifstmt->elseBranch()->visit(this);
    isElseFT = isFallThroughBranch(ifstmt->elseBranch());
  }

  nodeStack.pop_back();

  if (isThenFT && isElseFT) {
    if (elseScope) {
      thenScope->merge(elseScope);
      trunkScope->copyFrom(thenScope);
    }
    else {
      trunkScope->merge(thenScope);
    }
  }
  else if (isThenFT) {
    trunkScope->copyFrom(thenScope);
  }
  else if (elseScope && isElseFT) {
    trunkScope->copyFrom(elseScope);
  }

  if (elseScope)
    elseScope->~VarScope();

  thenScope->~VarScope();
  currentScope = trunkScope;
}